

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetKeyboardFocusHere(int offset)

{
  undefined4 uVar1;
  uint in_EDI;
  ImGuiScrollFlags scroll_flags;
  ImGuiNavMoveFlags move_flags;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 uVar2;
  ImGuiWindow *pIVar3;
  ImGuiContext *pIVar4;
  
  pIVar3 = GImGui->CurrentWindow;
  pIVar4 = GImGui;
  if ((GImGui->DebugLogFlags & 2U) != 0) {
    DebugLog("SetKeyboardFocusHere(%d) in window \"%s\"\n",(ulong)in_EDI,pIVar3->Name);
  }
  if (((pIVar4->DragDropActive & 1U) == 0) && (pIVar4->MovingWindow == (ImGuiWindow *)0x0)) {
    SetNavWindow((ImGuiWindow *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    uVar2 = 0x5600;
    uVar1 = 3;
    if ((pIVar3->Appearing & 1U) != 0) {
      uVar1 = 0x21;
    }
    NavMoveRequestSubmit
              ((ImGuiDir)((ulong)pIVar4 >> 0x20),(ImGuiDir)pIVar4,
               (ImGuiNavMoveFlags)((ulong)pIVar3 >> 0x20),(ImGuiScrollFlags)pIVar3);
    if (in_EDI == 0xffffffff) {
      NavMoveRequestResolveWithLastItem((ImGuiNavItemData *)CONCAT44(uVar2,uVar1));
    }
    else {
      pIVar4->NavTabbingDir = 1;
      pIVar4->NavTabbingCounter = in_EDI + 1;
    }
  }
  else if ((pIVar4->DebugLogFlags & 2U) != 0) {
    DebugLog("SetKeyboardFocusHere() ignored while DragDropActive!\n");
  }
  return;
}

Assistant:

void ImGui::SetKeyboardFocusHere(int offset)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(offset >= -1);    // -1 is allowed but not below
    IMGUI_DEBUG_LOG_FOCUS("SetKeyboardFocusHere(%d) in window \"%s\"\n", offset, window->Name);

    // It makes sense in the vast majority of cases to never interrupt a drag and drop.
    // When we refactor this function into ActivateItem() we may want to make this an option.
    // MovingWindow is protected from most user inputs using SetActiveIdUsingNavAndKeys(), but
    // is also automatically dropped in the event g.ActiveId is stolen.
    if (g.DragDropActive || g.MovingWindow != NULL)
    {
        IMGUI_DEBUG_LOG_FOCUS("SetKeyboardFocusHere() ignored while DragDropActive!\n");
        return;
    }

    SetNavWindow(window);

    ImGuiNavMoveFlags move_flags = ImGuiNavMoveFlags_IsTabbing | ImGuiNavMoveFlags_Activate | ImGuiNavMoveFlags_FocusApi | ImGuiNavMoveFlags_NoSetNavHighlight;
    ImGuiScrollFlags scroll_flags = window->Appearing ? ImGuiScrollFlags_KeepVisibleEdgeX | ImGuiScrollFlags_AlwaysCenterY : ImGuiScrollFlags_KeepVisibleEdgeX | ImGuiScrollFlags_KeepVisibleEdgeY;
    NavMoveRequestSubmit(ImGuiDir_None, offset < 0 ? ImGuiDir_Up : ImGuiDir_Down, move_flags, scroll_flags); // FIXME-NAV: Once we refactor tabbing, add LegacyApi flag to not activate non-inputable.
    if (offset == -1)
    {
        NavMoveRequestResolveWithLastItem(&g.NavMoveResultLocal);
    }
    else
    {
        g.NavTabbingDir = 1;
        g.NavTabbingCounter = offset + 1;
    }
}